

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alloc.h
# Opt level: O1

void __thiscall
embree::FastAllocator::Statistics::Statistics
          (Statistics *this,FastAllocator *alloc,AllocationType atype,bool huge_pages)

{
  size_t sVar1;
  long lVar2;
  bool bVar3;
  Block *block;
  Block *this_00;
  Block *block_1;
  Block *this_01;
  
  this->bytesUsed = 0;
  this->bytesFree = 0;
  this->bytesWasted = 0;
  this_01 = (alloc->usedBlocks)._M_b._M_p;
  this_00 = (alloc->freeBlocks)._M_b._M_p;
  if (this_01 != (Block *)0x0) {
    sVar1 = Block::getUsedBytes(this_01,atype,huge_pages);
    this->bytesUsed = this->bytesUsed + sVar1;
  }
  if (this_00 != (Block *)0x0) {
    sVar1 = Block::getAllocatedBytes(this_00,atype,huge_pages);
    this->bytesFree = this->bytesFree + sVar1;
  }
  if (this_01 != (Block *)0x0) {
    sVar1 = Block::getFreeBytes(this_01,atype,huge_pages);
    this->bytesFree = this->bytesFree + sVar1;
  }
  if (this_00 != (Block *)0x0) {
    lVar2 = 0;
    do {
      if (atype == ANY_TYPE) {
LAB_00c5ee4c:
        lVar2 = lVar2 + this_00->wasted + 0x40;
      }
      else {
        if (this_00->atype == EMBREE_OS_MALLOC) {
          bVar3 = this_00->huge_pages == huge_pages && atype == EMBREE_OS_MALLOC;
        }
        else {
          bVar3 = this_00->atype == atype;
        }
        if (bVar3) goto LAB_00c5ee4c;
      }
      this_00 = this_00->next;
    } while (this_00 != (Block *)0x0);
    this->bytesWasted = this->bytesWasted + lVar2;
  }
  if (this_01 != (Block *)0x0) {
    lVar2 = 0;
    do {
      if (atype == ANY_TYPE) {
LAB_00c5ee95:
        lVar2 = lVar2 + this_01->wasted + 0x40;
      }
      else {
        if (this_01->atype == EMBREE_OS_MALLOC) {
          bVar3 = this_01->huge_pages == huge_pages && atype == EMBREE_OS_MALLOC;
        }
        else {
          bVar3 = this_01->atype == atype;
        }
        if (bVar3) goto LAB_00c5ee95;
      }
      this_01 = this_01->next;
    } while (this_01 != (Block *)0x0);
    this->bytesWasted = this->bytesWasted + lVar2;
  }
  return;
}

Assistant:

Statistics (FastAllocator* alloc, AllocationType atype, bool huge_pages = false)
      : bytesUsed(0), bytesFree(0), bytesWasted(0)
      {
        Block* usedBlocks = alloc->usedBlocks.load();
        Block* freeBlocks = alloc->freeBlocks.load();
        if (usedBlocks) bytesUsed += usedBlocks->getUsedBytes(atype,huge_pages);
        if (freeBlocks) bytesFree += freeBlocks->getAllocatedBytes(atype,huge_pages);
        if (usedBlocks) bytesFree += usedBlocks->getFreeBytes(atype,huge_pages);
        if (freeBlocks) bytesWasted += freeBlocks->getWastedBytes(atype,huge_pages);
        if (usedBlocks) bytesWasted += usedBlocks->getWastedBytes(atype,huge_pages);
      }